

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraExec_cpp.h
# Opt level: O2

void __thiscall
moira::Moira::execMove5<(moira::Instr)71,(moira::Mode)8,(moira::Size)1>(Moira *this,u16 opcode)

{
  bool bVar1;
  undefined8 in_RAX;
  u32 data;
  u32 ea;
  undefined8 local_18;
  
  local_18 = in_RAX;
  bVar1 = readOp<(moira::Mode)8,(moira::Size)1,0ul>
                    (this,opcode & 7,(u32 *)((long)&local_18 + 4),(u32 *)&local_18);
  if (bVar1) {
    (this->reg).sr.n = (bool)((byte)local_18 >> 7);
    (this->reg).sr.z = (byte)local_18 == 0;
    (this->reg).sr.v = false;
    (this->reg).sr.c = false;
    bVar1 = writeOp<(moira::Mode)5,(moira::Size)1,0ul>(this,opcode >> 9 & 7,(u32)local_18);
    if (bVar1) {
      prefetch<4ul>(this);
      (this->reg).sr.n = (bool)((byte)local_18 >> 7);
      (this->reg).sr.z = (byte)local_18 == 0;
      (this->reg).sr.v = false;
      (this->reg).sr.c = false;
    }
  }
  return;
}

Assistant:

void
Moira::execMove5(u16 opcode)
{
    u32 ea, data;

    int src = _____________xxx(opcode);
    int dst = ____xxx_________(opcode);

    if (!readOp <M,S, STD_AE_FRAME> (src, ea, data)) return;
    
    if (S == Long && (M == MODE_DN || M == MODE_AN || M == MODE_IM)) {
        reg.sr.n = NBIT<Word>(data >> 16);
        reg.sr.z = ZERO<Word>(data >> 16) && reg.sr.z;
    } else {
        reg.sr.n = NBIT<S>(data);
        reg.sr.z = ZERO<S>(data);
        reg.sr.v = 0;
        reg.sr.c = 0;
    }
        
    if (!writeOp <MODE_DI,S> (dst, data)) return;
    prefetch<POLLIPL>();
    
    reg.sr.n = NBIT<S>(data);
    reg.sr.z = ZERO<S>(data);
    reg.sr.v = 0;
    reg.sr.c = 0;
}